

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# between_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::BetweenExpression::Copy(BetweenExpression *this)

{
  pointer pPVar1;
  pointer this_00;
  ParsedExpression *in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_30;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_28;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_20;
  _Head_base<0UL,_duckdb::BetweenExpression_*,_false> local_18;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 1));
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_20,pPVar1);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)&in_RSI[1].super_BaseExpression.type);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_28,pPVar1);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)&in_RSI[1].super_BaseExpression.alias);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_30,pPVar1);
  make_uniq<duckdb::BetweenExpression,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((duckdb *)&local_18,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_20,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_28,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_30);
  if (local_30._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_30._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_28._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_20._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  this_00 = unique_ptr<duckdb::BetweenExpression,_std::default_delete<duckdb::BetweenExpression>,_true>
            ::operator->((unique_ptr<duckdb::BetweenExpression,_std::default_delete<duckdb::BetweenExpression>,_true>
                          *)&local_18);
  ParsedExpression::CopyProperties(&this_00->super_ParsedExpression,in_RSI);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_18._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> BetweenExpression::Copy() const {
	auto copy = make_uniq<BetweenExpression>(input->Copy(), lower->Copy(), upper->Copy());
	copy->CopyProperties(*this);
	return std::move(copy);
}